

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O3

void __thiscall CProjectile::Tick(CProjectile *this)

{
  uint uVar1;
  int iVar2;
  CGameWorld *pCVar3;
  IServer *pIVar4;
  vec2 Force;
  vec2 vVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  CCharacter *pCVar9;
  long in_FS_OFFSET;
  float fVar10;
  vec2 CurPos;
  vec2 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CEntity).m_pGameWorld;
  pIVar4 = pCVar3->m_pServer;
  iVar8 = pIVar4->m_CurrentGameTick;
  uVar1 = this->m_StartTick;
  fVar10 = (float)pIVar4->m_TickSpeed;
  vVar5 = GetPos(this,(float)(int)(~uVar1 + iVar8) / fVar10);
  local_30 = GetPos(this,(float)(int)(iVar8 - uVar1) / fVar10);
  iVar7 = CCollision::IntersectLine
                    (&pCVar3->m_pGameServer->m_Collision,vVar5,local_30,&local_30,(vec2 *)0x0);
  pCVar9 = CGameContext::GetPlayerChar
                     (((this->super_CEntity).m_pGameWorld)->m_pGameServer,this->m_Owner);
  pCVar9 = CGameWorld::IntersectCharacter
                     ((this->super_CEntity).m_pGameWorld,vVar5,local_30,6.0,&local_30,
                      &pCVar9->super_CEntity);
  iVar2 = this->m_LifeSpan;
  iVar8 = iVar2 + -1;
  this->m_LifeSpan = iVar8;
  if (0 < iVar2 && (iVar7 == 0 && pCVar9 == (CCharacter *)0x0)) {
    bVar6 = CEntity::GameLayerClipped(&this->super_CEntity,local_30);
    if (!bVar6) goto LAB_001186b9;
    iVar8 = this->m_LifeSpan;
  }
  if ((-1 < iVar8) || (this->m_Weapon == 3)) {
    CGameContext::CreateSound
              (((this->super_CEntity).m_pGameWorld)->m_pGameServer,local_30,this->m_SoundImpact,-1);
  }
  if (this->m_Explosive == true) {
    CGameContext::CreateExplosion
              (((this->super_CEntity).m_pGameWorld)->m_pGameServer,local_30,this->m_Owner,
               this->m_Weapon,this->m_Damage);
  }
  else if (pCVar9 != (CCharacter *)0x0) {
    fVar10 = 0.001;
    if (0.001 <= this->m_Force) {
      fVar10 = this->m_Force;
    }
    vVar5 = this->m_Direction;
    Force.field_1.y = fVar10 * vVar5.field_1.y;
    Force.field_0.x = fVar10 * vVar5.field_0.x;
    CCharacter::TakeDamage
              (pCVar9,Force,(vec2)((ulong)vVar5 ^ 0x8000000080000000),this->m_Damage,this->m_Owner,
               this->m_Weapon);
  }
  CGameWorld::DestroyEntity((this->super_CEntity).m_pGameWorld,&this->super_CEntity);
LAB_001186b9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CProjectile::Tick()
{
	float Pt = (Server()->Tick()-m_StartTick-1)/(float)Server()->TickSpeed();
	float Ct = (Server()->Tick()-m_StartTick)/(float)Server()->TickSpeed();
	vec2 PrevPos = GetPos(Pt);
	vec2 CurPos = GetPos(Ct);
	int Collide = GameServer()->Collision()->IntersectLine(PrevPos, CurPos, &CurPos, 0);
	CCharacter *OwnerChar = GameServer()->GetPlayerChar(m_Owner);
	CCharacter *TargetChr = GameWorld()->IntersectCharacter(PrevPos, CurPos, 6.0f, CurPos, OwnerChar);

	m_LifeSpan--;

	if(TargetChr || Collide || m_LifeSpan < 0 || GameLayerClipped(CurPos))
	{
		if(m_LifeSpan >= 0 || m_Weapon == WEAPON_GRENADE)
			GameServer()->CreateSound(CurPos, m_SoundImpact);

		if(m_Explosive)
			GameServer()->CreateExplosion(CurPos, m_Owner, m_Weapon, m_Damage);

		else if(TargetChr)
			TargetChr->TakeDamage(m_Direction * maximum(0.001f, m_Force), m_Direction*-1, m_Damage, m_Owner, m_Weapon);

		GameWorld()->DestroyEntity(this);
	}
}